

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_operator_expression.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,OperatorExpression *op,
          idx_t depth)

{
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *this_00;
  ExpressionType EVar1;
  pointer puVar2;
  bool bVar3;
  LogicalTypeId LVar4;
  int iVar5;
  reference pvVar6;
  pointer pEVar7;
  BoundConstantExpression *pBVar8;
  pointer puVar9;
  type pPVar10;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar11;
  reference pvVar12;
  BoundOperatorExpression *this_01;
  pointer pBVar13;
  ParameterNotResolvedException *this_02;
  BinderException *pBVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  char *pcVar16;
  pointer puVar17;
  uint uVar18;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  pointer __args;
  size_type sVar19;
  LogicalType *this_03;
  _Alloc_hider _Var20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var22;
  templated_unique_single_t result;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  string function_name;
  LogicalType result_type;
  ErrorData error;
  _Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false> local_310;
  _Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false> local_308;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_300;
  Value local_2f8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_2b8;
  char *local_2b0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  LogicalType local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_210 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_200 [2];
  string local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  string local_170;
  string local_150;
  undefined1 local_130 [128];
  undefined1 local_b0 [128];
  
  if ((op->super_ParsedExpression).super_BaseExpression.type == GROUPING_FUNCTION) {
    (*this->_vptr_ExpressionBinder[7])(__return_storage_ptr__,this,op,depth);
    return __return_storage_ptr__;
  }
  ErrorData::ErrorData((ErrorData *)local_130);
  this_00 = &op->children;
  puVar9 = (op->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar17 = puVar9;
  if (puVar9 != (op->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    sVar19 = 0;
    do {
      pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::operator[](this_00,sVar19);
      BindChild(this,pvVar6,depth,(ErrorData *)local_130);
      sVar19 = sVar19 + 1;
      puVar9 = (op->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar17 = (op->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (sVar19 < (ulong)((long)puVar17 - (long)puVar9 >> 3));
  }
  if (local_130[0] != false) {
    local_b0._0_2_ = local_130._0_2_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._8_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_130 + 0x18)) {
      local_b0._32_4_ = local_130._32_4_;
      local_b0._36_4_ = local_130._36_4_;
      local_b0._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_b0 + 0x18);
    }
    else {
      local_b0._8_8_ = local_130._8_8_;
    }
    local_b0._16_8_ = local_130._16_8_;
    local_130._16_8_ = 0;
    local_130._24_4_ = local_130._24_4_ & 0xffffff00;
    if ((undefined1 *)local_130._40_8_ == local_130 + 0x38) {
      local_b0._64_4_ = local_130._64_4_;
      local_b0._68_4_ = local_130._68_4_;
      local_b0._40_8_ = local_b0 + 0x38;
    }
    else {
      local_b0._40_8_ = local_130._40_8_;
    }
    local_b0._48_8_ = local_130._48_8_;
    local_130._48_8_ = 0;
    local_130._56_4_ = local_130._56_4_ & 0xffffff00;
    local_130._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_130 + 0x18);
    local_130._40_8_ = local_130 + 0x38;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(local_b0 + 0x48),local_130 + 0x48);
    BindResult::BindResult(__return_storage_ptr__,(ErrorData *)local_b0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_b0 + 0x48));
    if ((undefined1 *)local_b0._40_8_ != local_b0 + 0x38) {
      operator_delete((void *)local_b0._40_8_);
    }
    _Var20._M_p = (pointer)local_b0._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._8_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_b0 + 0x18)) goto LAB_00d7ac9b;
    goto LAB_00d7ac96;
  }
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  local_288._M_string_length = 0;
  local_288.field_2._M_local_buf[0] = '\0';
  EVar1 = (op->super_ParsedExpression).super_BaseExpression.type;
  uVar18 = EVar1 - 0x99;
  if (5 < uVar18) {
    if (EVar1 != OPERATOR_UNPACK) goto LAB_00d7b254;
    p_Var22 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_2f8 + 0x10);
    local_2f8.type_._0_8_ = p_Var22;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2f8,"UNPACK not allowed here, should have been resolved earlier","")
    ;
    BindResult::BindResult(__return_storage_ptr__,(string *)&local_2f8);
    p_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_2f8.type_._0_8_;
LAB_00d7ad2a:
    if (p_Var21 != p_Var22) {
      operator_delete(p_Var21);
    }
    goto LAB_00d7b402;
  }
  pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&switchD_00d7ab92::switchdataD_01d878b4 +
            (long)(int)(&switchD_00d7ab92::switchdataD_01d878b4)[uVar18]);
  switch((uint)EVar1) {
  case 0x99:
    pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::operator[](this_00,0);
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(pvVar6);
    puVar11 = BoundExpression::GetExpression(pPVar10);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(puVar11);
    if ((pEVar7->return_type).id_ == MAP) {
      pcVar16 = "map_extract_value";
    }
    else {
      bVar3 = LogicalType::IsJSONType(&pEVar7->return_type);
      pcVar16 = "array_extract";
      if ((bVar3) &&
         ((long)(op->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(op->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x10)) {
        ::std::__cxx11::string::operator=((string *)&local_288,"json_extract");
        pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 ::operator[](this_00,1);
        pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(pvVar6);
        puVar11 = BoundExpression::GetExpression(pPVar10);
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(puVar11);
        if ((pEVar7->super_BaseExpression).expression_class == BOUND_CONSTANT) {
          pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(puVar11);
          pBVar8 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                             (&pEVar7->super_BaseExpression);
          if ((pBVar8->value).is_null != false) goto LAB_00d7b1fb;
          local_248[0] = local_238;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"$[%s]","");
          Value::ToString_abi_cxx11_(&local_170,&pBVar8->value);
          StringUtil::Format<std::__cxx11::string>
                    (&local_150,(StringUtil *)local_248,&local_170,pbVar15);
          Value::Value(&local_2f8,&local_150);
          Value::operator=(&pBVar8->value,&local_2f8);
          Value::~Value(&local_2f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
          if (local_248[0] != local_238) {
            operator_delete(local_248[0]);
          }
          LogicalType::LogicalType(&local_2f8.type_,VARCHAR);
LAB_00d7b1bf:
          LogicalType::operator=(&(pBVar8->super_Expression).return_type,&local_2f8.type_);
          LogicalType::~LogicalType(&local_2f8.type_);
        }
        goto LAB_00d7b1fb;
      }
    }
    ::std::__cxx11::string::operator=((string *)&local_288,pcVar16);
    goto LAB_00d7b1fb;
  case 0x9a:
    pcVar16 = "array_slice";
    break;
  case 0x9b:
    pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::operator[](this_00,0);
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(pvVar6);
    puVar11 = BoundExpression::GetExpression(pPVar10);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(puVar11);
    iVar5 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[6])(pEVar7);
    if (((char)iVar5 != '\0') ||
       (pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(puVar11), (pEVar7->return_type).id_ == UNKNOWN)) {
      this_02 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_02);
      __cxa_throw(this_02,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::operator[](this_00,1);
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(pvVar6);
    local_2b8 = BoundExpression::GetExpression(pPVar10);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(puVar11);
    this_03 = &pEVar7->return_type;
    LVar4 = (pEVar7->return_type).id_;
    pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)LVar4;
    local_2b0 = "union_extract";
    if (LVar4 < MAP) {
      if (LVar4 == SQLNULL) {
LAB_00d7b075:
        if (LVar4 != UNION) {
          if (LVar4 != MAP) goto LAB_00d7b091;
          local_2b0 = "map_extract_value";
        }
      }
      else {
        if (LVar4 != STRUCT) {
LAB_00d7b062:
          bVar3 = LogicalType::IsJSONType(this_03);
          if (!bVar3) {
            p_Var22 = local_200;
            local_210[0] = p_Var22;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_210,
                       "Cannot extract field %s from expression \"%s\" because it is not a struct, union, map, or json"
                       ,"");
            pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(local_2b8);
            (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_190,pEVar7);
            pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(puVar11);
            (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_1b0,pEVar7);
            StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                      ((string *)&local_2f8,(StringUtil *)local_210,&local_190,&local_1b0,in_R8);
            BindResult::BindResult(__return_storage_ptr__,(string *)&local_2f8);
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_2f8.type_._0_8_ !=
                (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_2f8 + 0x10U)) {
              operator_delete((void *)local_2f8.type_._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p);
            }
            p_Var21 = local_210[0];
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              operator_delete(local_190._M_dataplus._M_p);
              p_Var21 = local_210[0];
            }
            goto LAB_00d7ad2a;
          }
          LVar4 = this_03->id_;
          goto LAB_00d7b075;
        }
LAB_00d7b091:
        bVar3 = LogicalType::IsJSONType(this_03);
        if (bVar3) {
          ::std::__cxx11::string::operator=((string *)&local_288,"json_extract");
          pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(local_2b8);
          if ((pEVar7->super_BaseExpression).expression_class == BOUND_CONSTANT) {
            pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(local_2b8);
            pBVar8 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                               (&pEVar7->super_BaseExpression);
            if ((pBVar8->value).is_null == false) {
              local_268[0] = local_258;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"$.\"%s\"","");
              Value::ToString_abi_cxx11_(&local_1f0,&pBVar8->value);
              StringUtil::Format<std::__cxx11::string>
                        (&local_1d0,(StringUtil *)local_268,&local_1f0,pbVar15);
              Value::Value(&local_2f8,&local_1d0);
              Value::operator=(&pBVar8->value,&local_2f8);
              Value::~Value(&local_2f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                operator_delete(local_1d0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p);
              }
              if (local_268[0] != local_258) {
                operator_delete(local_268[0]);
              }
              LogicalType::LogicalType(&local_2f8.type_,VARCHAR);
              goto LAB_00d7b1bf;
            }
          }
          goto LAB_00d7b1fb;
        }
        local_2b0 = "struct_extract";
      }
    }
    else {
      if (LVar4 == MAP) goto LAB_00d7b075;
      if (LVar4 != UNION) goto LAB_00d7b062;
    }
    ::std::__cxx11::string::operator=((string *)&local_288,local_2b0);
    goto LAB_00d7b1fb;
  case 0x9c:
    pcVar16 = "list_value";
    break;
  case 0x9d:
    pcVar16 = "json_extract";
    break;
  case 0x9e:
    pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::operator[](this_00,0);
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(pvVar6);
    puVar11 = BoundExpression::GetExpression(pPVar10);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(puVar11);
    iVar5 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[4])(pEVar7);
    if ((char)iVar5 != '\0') {
      pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
      local_2f8.type_._0_8_ = (long)&local_2f8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f8,"TRY can not be used in combination with a scalar subquery",""
                );
      BinderException::BinderException(pBVar14,(string *)&local_2f8);
      __cxa_throw(pBVar14,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(puVar11);
    iVar5 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[0xc])(pEVar7);
    if ((char)iVar5 != '\0') {
      pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
      local_2f8.type_._0_8_ = (long)&local_2f8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f8,"TRY can not be used in combination with a volatile function",
                 "");
      BinderException::BinderException(pBVar14,(string *)&local_2f8);
      __cxa_throw(pBVar14,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    goto LAB_00d7b1fb;
  }
  ::std::__cxx11::string::_M_replace((ulong)&local_288,0,(char *)0x0,(ulong)pcVar16);
LAB_00d7b1fb:
  if (local_288._M_string_length == 0) {
    puVar9 = (op->children).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar17 = (op->children).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
LAB_00d7b254:
    local_2a8.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)0x0;
    local_2a8.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)0x0;
    local_2a8.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar17 != puVar9) {
      sVar19 = 0;
      do {
        pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 ::operator[](this_00,sVar19);
        pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(pvVar6);
        puVar11 = BoundExpression::GetExpression(pPVar10);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_2a8,puVar11);
        sVar19 = sVar19 + 1;
      } while (sVar19 < (ulong)((long)(op->children).
                                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(op->children).
                                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    ResolveOperatorType(&local_228,this,op,
                        (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                         *)&local_2a8);
    EVar1 = (op->super_ParsedExpression).super_BaseExpression.type;
    if (EVar1 == OPERATOR_COALESCE) {
      if (local_2a8.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_2a8.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
        local_2f8.type_._0_8_ = (long)&local_2f8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2f8,"COALESCE needs at least one child","");
        BinderException::BinderException(pBVar14,(string *)&local_2f8);
        __cxa_throw(pBVar14,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((long)local_2a8.
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_2a8.
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 8) goto LAB_00d7b331;
      pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                              *)&local_2a8,0);
      local_300._M_head_impl =
           (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      BindResult::BindResult
                (__return_storage_ptr__,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_300);
      if (local_300._M_head_impl != (Expression *)0x0) {
        (*((local_300._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_300._M_head_impl = (Expression *)0x0;
    }
    else {
LAB_00d7b331:
      this_01 = (BoundOperatorExpression *)operator_new(0x70);
      LogicalType::LogicalType(&local_2f8.type_,&local_228);
      BoundOperatorExpression::BoundOperatorExpression(this_01,EVar1,&local_2f8.type_);
      local_310._M_head_impl = this_01;
      LogicalType::~LogicalType(&local_2f8.type_);
      puVar2 = local_2a8.
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_2a8.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_2a8.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __args = local_2a8.
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          pBVar13 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                    ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                                  *)&local_310);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&pBVar13->children,__args);
          __args = __args + 1;
        } while (__args != puVar2);
      }
      local_308._M_head_impl = local_310._M_head_impl;
      local_310._M_head_impl = (BoundOperatorExpression *)0x0;
      BindResult::BindResult
                (__return_storage_ptr__,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_308);
      if (local_308._M_head_impl != (BoundOperatorExpression *)0x0) {
        (*((local_308._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])
                  ();
      }
      local_308._M_head_impl = (BoundOperatorExpression *)0x0;
      if (local_310._M_head_impl != (BoundOperatorExpression *)0x0) {
        (*((local_310._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])
                  ();
      }
    }
    LogicalType::~LogicalType(&local_228);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector(&local_2a8);
  }
  else {
    make_uniq_base<duckdb::ParsedExpression,duckdb::FunctionExpression,std::__cxx11::string&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_2f8,&local_288,this_00);
    (*this->_vptr_ExpressionBinder[5])(__return_storage_ptr__,this,&local_2f8,depth,0);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_2f8.type_._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (**(code **)&(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_2f8.type_._0_8_)->
                   _M_use_count)();
    }
  }
LAB_00d7b402:
  _Var20._M_p = local_288._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
LAB_00d7ac96:
    operator_delete(_Var20._M_p);
  }
LAB_00d7ac9b:
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_130 + 0x48));
  if ((undefined1 *)local_130._40_8_ != local_130 + 0x38) {
    operator_delete((void *)local_130._40_8_);
  }
  if ((undefined1 *)local_130._8_8_ != local_130 + 0x18) {
    operator_delete((void *)local_130._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindExpression(OperatorExpression &op, idx_t depth) {
	if (op.GetExpressionType() == ExpressionType::GROUPING_FUNCTION) {
		return BindGroupingFunction(op, depth);
	}

	// Bind the children of the operator expression. We already create bound expressions.
	// Only those children that trigger an error are not yet bound.
	ErrorData error;
	for (idx_t i = 0; i < op.children.size(); i++) {
		BindChild(op.children[i], depth, error);
	}
	if (error.HasError()) {
		return BindResult(std::move(error));
	}

	// all children bound successfully
	string function_name;
	switch (op.GetExpressionType()) {
	case ExpressionType::OPERATOR_UNPACK:
		return BindResult("UNPACK not allowed here, should have been resolved earlier");
	case ExpressionType::ARRAY_EXTRACT: {
		D_ASSERT(op.children[0]->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
		auto &b_exp = BoundExpression::GetExpression(*op.children[0]);
		const auto &b_exp_type = b_exp->return_type;
		if (b_exp_type.id() == LogicalTypeId::MAP) {
			function_name = "map_extract_value";
		} else if (b_exp_type.IsJSONType() && op.children.size() == 2) {
			function_name = "json_extract";
			// Make sure we only extract array elements, not fields, by adding the $[] syntax
			auto &i_exp = BoundExpression::GetExpression(*op.children[1]);
			if (i_exp->GetExpressionClass() == ExpressionClass::BOUND_CONSTANT) {
				auto &const_exp = i_exp->Cast<BoundConstantExpression>();
				if (!const_exp.value.IsNull()) {
					const_exp.value = StringUtil::Format("$[%s]", const_exp.value.ToString());
					const_exp.return_type = LogicalType::VARCHAR;
				}
			}
		} else {
			function_name = "array_extract";
		}
		break;
	}
	case ExpressionType::ARRAY_SLICE:
		function_name = "array_slice";
		break;
	case ExpressionType::STRUCT_EXTRACT: {
		D_ASSERT(op.children.size() == 2);
		D_ASSERT(op.children[0]->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
		D_ASSERT(op.children[1]->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
		auto &extract_exp = BoundExpression::GetExpression(*op.children[0]);
		if (extract_exp->HasParameter() || extract_exp->return_type.id() == LogicalTypeId::UNKNOWN) {
			throw ParameterNotResolvedException();
		}
		auto &name_exp = BoundExpression::GetExpression(*op.children[1]);
		const auto &extract_expr_type = extract_exp->return_type;
		if (extract_expr_type.id() != LogicalTypeId::STRUCT && extract_expr_type.id() != LogicalTypeId::UNION &&
		    extract_expr_type.id() != LogicalTypeId::MAP && extract_expr_type.id() != LogicalTypeId::SQLNULL &&
		    !extract_expr_type.IsJSONType()) {
			return BindResult(StringUtil::Format(
			    "Cannot extract field %s from expression \"%s\" because it is not a struct, union, map, or json",
			    name_exp->ToString(), extract_exp->ToString()));
		}
		if (extract_expr_type.id() == LogicalTypeId::UNION) {
			function_name = "union_extract";
		} else if (extract_expr_type.id() == LogicalTypeId::MAP) {
			function_name = "map_extract_value";
		} else if (extract_expr_type.IsJSONType()) {
			function_name = "json_extract";
			// Make sure we only extract fields, not array elements, by adding $. syntax
			if (name_exp->GetExpressionClass() == ExpressionClass::BOUND_CONSTANT) {
				auto &const_exp = name_exp->Cast<BoundConstantExpression>();
				if (!const_exp.value.IsNull()) {
					const_exp.value = StringUtil::Format("$.\"%s\"", const_exp.value.ToString());
					const_exp.return_type = LogicalType::VARCHAR;
				}
			}
		} else {
			function_name = "struct_extract";
		}
		break;
	}
	case ExpressionType::ARRAY_CONSTRUCTOR:
		function_name = "list_value";
		break;
	case ExpressionType::ARROW:
		function_name = "json_extract";
		break;
	case ExpressionType::OPERATOR_TRY: {
		auto &expr = BoundExpression::GetExpression(*op.children[0]);
		if (expr->HasSubquery()) {
			throw BinderException("TRY can not be used in combination with a scalar subquery");
		}
		if (expr->IsVolatile()) {
			throw BinderException("TRY can not be used in combination with a volatile function");
		}
		break;
	}
	default:
		break;
	}
	if (!function_name.empty()) {
		auto function = make_uniq_base<ParsedExpression, FunctionExpression>(function_name, std::move(op.children));
		return BindExpression(function, depth, false);
	}

	vector<unique_ptr<Expression>> children;
	for (idx_t i = 0; i < op.children.size(); i++) {
		D_ASSERT(op.children[i]->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
		children.push_back(std::move(BoundExpression::GetExpression(*op.children[i])));
	}
	// now resolve the types
	LogicalType result_type = ResolveOperatorType(op, children);
	if (op.GetExpressionType() == ExpressionType::OPERATOR_COALESCE) {
		if (children.empty()) {
			throw BinderException("COALESCE needs at least one child");
		}
		if (children.size() == 1) {
			return BindResult(std::move(children[0]));
		}
	}

	auto result = make_uniq<BoundOperatorExpression>(op.GetExpressionType(), result_type);
	for (auto &child : children) {
		result->children.push_back(std::move(child));
	}
	return BindResult(std::move(result));
}